

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O2

int gzip_filter_close(archive_read_filter *self)

{
  void *__ptr;
  int iVar1;
  int iVar2;
  
  __ptr = self->data;
  iVar2 = 0;
  if (*(char *)((long)__ptr + 0x70) != '\0') {
    iVar1 = inflateEnd(__ptr);
    if (iVar1 != 0) {
      archive_set_error(&self->archive->archive,-1,"Failed to clean up gzip compressor");
      iVar2 = -0x1e;
    }
  }
  free(*(void **)((long)__ptr + 0xa0));
  free(*(void **)((long)__ptr + 0x78));
  free(__ptr);
  return iVar2;
}

Assistant:

static int
gzip_filter_close(struct archive_read_filter *self)
{
	struct private_data *state;
	int ret;

	state = (struct private_data *)self->data;
	ret = ARCHIVE_OK;

	if (state->in_stream) {
		switch (inflateEnd(&(state->stream))) {
		case Z_OK:
			break;
		default:
			archive_set_error(&(self->archive->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Failed to clean up gzip compressor");
			ret = ARCHIVE_FATAL;
		}
	}

	free(state->name);
	free(state->out_block);
	free(state);
	return (ret);
}